

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  void *pvVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int *piVar9;
  pointer piVar10;
  undefined1 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  undefined4 *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int k_1;
  long lVar25;
  float *pfVar26;
  ulong uVar27;
  size_type __n;
  Mat *pMVar28;
  ulong uVar29;
  bool bVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  undefined1 extraout_var [12];
  undefined1 auVar34 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar35 [16];
  float fVar36;
  undefined1 in_XMM4 [16];
  long lStack_1e0;
  allocator_type local_1b1;
  ulong local_1b0;
  void *local_1a8;
  long local_1a0;
  int local_194;
  ulong local_190;
  undefined8 local_188;
  Mat *local_180;
  ulong local_178;
  int local_16c;
  Mat local_168;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  ulong local_c8;
  Mat local_c0;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar14 = bottom_blob->c;
  iVar12 = -100;
  if ((iVar14 % this->group == 0) && (this->num_output % this->group == 0)) {
    iVar13 = this->kernel_w;
    iVar16 = this->dilation_w;
    iVar17 = this->kernel_h;
    iVar23 = this->dilation_h;
    local_c0.elemsize = bottom_blob->elemsize;
    local_c0.data = bottom_blob->data;
    local_c0.refcount = bottom_blob->refcount;
    local_c0.elempack = bottom_blob->elempack;
    local_c0.allocator = bottom_blob->allocator;
    local_c0.dims = bottom_blob->dims;
    local_c0.w = bottom_blob->w;
    local_c0.h = bottom_blob->h;
    local_c0.d = bottom_blob->d;
    local_c0.cstep = bottom_blob->cstep;
    if (local_c0.refcount != (int *)0x0) {
      LOCK();
      *local_c0.refcount = *local_c0.refcount + 1;
      UNLOCK();
    }
    local_180 = top_blob;
    local_c0.c = iVar14;
    if (local_c0.elemsize != 1) {
      local_1a8 = (void *)CONCAT44(local_1a8._4_4_,this->group);
      local_168.cstep = 0;
      local_168.data = (undefined4 *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      uVar21 = 0;
      Mat::create(&local_168,iVar14,4,(Allocator *)0x0);
      iVar12 = iVar14 / (int)local_1a8;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      pvVar3 = (this->bottom_blob_int8_scales).data;
      puVar18 = (undefined4 *)local_168.data;
      uVar27 = (ulong)(uint)this->group;
      if (this->group < 1) {
        uVar27 = uVar21;
      }
      for (; uVar21 != uVar27; uVar21 = uVar21 + 1) {
        uVar1 = *(undefined4 *)((long)pvVar3 + uVar21 * 4);
        iVar22 = iVar12;
        while (bVar30 = iVar22 != 0, iVar22 = iVar22 + -1, bVar30) {
          *puVar18 = uVar1;
          puVar18 = puVar18 + 1;
        }
      }
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      quantize_to_int8(bottom_blob,&local_c0,&local_168,(Option *)&_space_ofs);
      piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    make_padding(this,&local_c0,&local_168,opt);
    iVar22 = local_168.w;
    iVar12 = -100;
    if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
      uVar21 = (long)(~((iVar13 + -1) * iVar16) + local_168.w) / (long)this->stride_w;
      uVar27 = (long)(~((iVar17 + -1) * iVar23) + local_168.h) / (long)this->stride_h;
      __n = (long)this->kernel_h * (long)this->kernel_w;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,&local_1b1);
      piVar10 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar28 = local_180;
      iVar12 = this->dilation_h;
      iVar13 = this->kernel_w;
      iVar16 = this->dilation_w * iVar13;
      iVar23 = 0;
      lVar24 = 0;
      for (iVar17 = 0; iVar17 < this->kernel_h; iVar17 = iVar17 + 1) {
        for (lVar25 = 0; (int)lVar25 < iVar13; lVar25 = lVar25 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar24 + lVar25] = iVar23;
          iVar23 = iVar23 + this->dilation_w;
          iVar13 = this->kernel_w;
        }
        iVar23 = iVar23 + (iVar22 * iVar12 - iVar16);
        lVar24 = (int)lVar24 + lVar25;
      }
      local_194 = this->int8_scale_term;
      local_1b0 = uVar21 & 0xffffffff;
      local_178 = uVar27 & 0xffffffff;
      Mat::create(local_180,(int)uVar21 + 1,(int)uVar27 + 1,this->num_output,
                  (ulong)(local_194 < 0x65) * 3 + 1,opt->blob_allocator);
      local_188 = 0xffffffffffffff9c;
      if ((pMVar28->data != (void *)0x0) && ((long)pMVar28->c * pMVar28->cstep != 0)) {
        iVar12 = this->group;
        iVar13 = (int)__n;
        if (iVar12 == this->num_output && iVar14 == iVar12) {
          local_188 = 0;
          uVar21 = 0;
          if (0 < iVar13) {
            uVar21 = __n & 0xffffffff;
          }
          local_190 = 0;
          uVar27 = local_1b0;
          for (lVar24 = 0; uVar29 = local_190, lVar24 < iVar14; lVar24 = lVar24 + 1) {
            pfVar26 = (float *)(pMVar28->cstep * lVar24 * pMVar28->elemsize + (long)pMVar28->data);
            lVar19 = (long)local_168.w;
            lVar25 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
            local_1a8 = (void *)(local_168.cstep * lVar24 * lVar25 + (long)local_168.data);
            pvVar3 = (this->weight_data).data;
            iVar14 = 0;
            local_1a0 = lVar24;
            while (iVar14 <= (int)local_178) {
              local_118._0_4_ = iVar14;
              for (iVar12 = 0; iVar12 <= (int)uVar27; iVar12 = iVar12 + 1) {
                iVar13 = 0;
                for (uVar20 = 0; uVar21 != uVar20; uVar20 = uVar20 + 1) {
                  iVar13 = iVar13 + (int)*(char *)((long)pvVar3 + uVar20 + uVar29) *
                                    (int)*(char *)((long)local_1a8 +
                                                  (long)piVar10[uVar20] +
                                                  (long)this->stride_h * (long)iVar14 *
                                                  lVar19 * lVar25 +
                                                  (long)iVar12 * (long)this->stride_w);
                }
                fVar33 = *(float *)((long)(this->weight_data_int8_scales).data + lVar24 * 4);
                fVar32 = 0.0;
                if (fVar33 != 0.0) {
                  fVar32 = 1.0 / (fVar33 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                     lVar24 * 4));
                }
                fVar32 = (float)iVar13 * fVar32;
                if (this->bias_term != 0) {
                  fVar32 = fVar32 + *(float *)((long)(this->bias_data).data + lVar24 * 4);
                }
                in_XMM4._0_4_ = fVar32;
                auVar34 = in_XMM4;
                switch(this->activation_type) {
                case 1:
                  if (fVar32 <= 0.0) {
                    auVar7._12_4_ = 0;
                    auVar7._0_12_ = in_XMM4._4_12_;
                    auVar34 = auVar7 << 0x20;
                    in_XMM4 = auVar34;
                  }
                  break;
                case 2:
                  auVar34 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar32) &
                                                   *(this->activation_params).data |
                                                  -(uint)(0.0 < fVar32) & 0x3f800000) * fVar32));
                  break;
                case 3:
                  pfVar4 = (float *)(this->activation_params).data;
                  fVar33 = *pfVar4;
                  if (fVar32 <= fVar33) {
                    in_XMM4._0_4_ = fVar33;
                  }
                  fVar32 = pfVar4[1];
                  auVar34 = in_XMM4;
                  if (fVar32 < in_XMM4._0_4_) {
LAB_003877c7:
                    auVar34 = ZEXT416((uint)fVar32);
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar32) {
                    in_XMM4._0_4_ = 0x42b0c0a5;
                  }
                  uVar31 = -(uint)(in_XMM4._0_4_ < -88.37626);
                  auVar5._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
                  auVar5._0_4_ = ~uVar31 & (uint)-in_XMM4._0_4_;
                  auVar5._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
                  auVar5._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
                  in_XMM4 = ZEXT416(uVar31 & 0x42b0c0a5) | auVar5;
                  fVar33 = expf(in_XMM4._0_4_);
                  uVar27 = local_1b0;
                  lVar24 = local_1a0;
                  auVar34 = ZEXT416((uint)(1.0 / (fVar33 + 1.0)));
                  break;
                case 5:
                  local_108 = in_XMM4;
                  fVar33 = expf(fVar32);
                  fVar33 = logf(fVar33 + 1.0);
                  fVar33 = tanhf(fVar33);
                  auVar34._0_4_ = fVar33 * (float)local_108._0_4_;
                  auVar34._4_12_ = extraout_var;
                  uVar27 = local_1b0;
                  lVar24 = local_1a0;
                  break;
                case 6:
                  pfVar4 = (float *)(this->activation_params).data;
                  fVar33 = *pfVar4;
                  fVar2 = pfVar4[1];
                  fVar36 = -fVar2 / fVar33;
                  auVar34 = ZEXT816(0);
                  if ((fVar36 <= fVar32) && (auVar34 = in_XMM4, fVar32 <= fVar36 + 1.0 / fVar33)) {
                    fVar32 = (fVar33 * fVar32 + fVar2) * fVar32;
                    goto LAB_003877c7;
                  }
                }
                if (local_194 < 0x65) {
                  *pfVar26 = auVar34._0_4_;
                  lStack_1e0 = 4;
                }
                else {
                  fVar33 = roundf(auVar34._0_4_ *
                                  *(float *)((long)(this->top_blob_int8_scales).data + lVar24 * 4));
                  iVar13 = (int)fVar33;
                  if (iVar13 < -0x7e) {
                    iVar13 = -0x7f;
                  }
                  uVar11 = (undefined1)iVar13;
                  if (0x7e < iVar13) {
                    uVar11 = 0x7f;
                  }
                  *(undefined1 *)pfVar26 = uVar11;
                  lStack_1e0 = 1;
                  uVar27 = local_1b0;
                  lVar24 = local_1a0;
                }
                pfVar26 = (float *)((long)pfVar26 + lStack_1e0);
              }
              iVar14 = local_118._0_4_ + 1;
            }
            iVar14 = this->group;
            local_190 = local_190 + __n;
            pMVar28 = local_180;
          }
        }
        else {
          uVar21 = (long)this->num_output / (long)iVar12;
          iVar17 = (int)((long)iVar14 / (long)iVar12);
          iVar16 = (int)uVar21;
          local_16c = iVar16 * iVar17 * iVar13;
          local_188 = 0;
          uVar27 = 0;
          if (0 < iVar13) {
            uVar27 = __n & 0xffffffff;
          }
          uVar29 = 0;
          if (0 < iVar17) {
            uVar29 = (long)iVar14 / (long)iVar12 & 0xffffffff;
          }
          local_e0 = (long)(iVar17 * iVar13);
          local_c8 = 0;
          if (0 < iVar16) {
            local_c8 = uVar21 & 0xffffffff;
          }
          local_e8 = (long)iVar17;
          local_f0 = (long)iVar16;
          uVar21 = local_178;
          uVar20 = local_1b0;
          for (lVar24 = 0; lVar24 < iVar12; lVar24 = lVar24 + 1) {
            local_d0 = lVar24 * local_f0;
            local_d8 = (long)(local_16c * (int)lVar24);
            lVar25 = lVar24 * local_e8;
            uVar15 = 0;
            while (uVar15 != local_c8) {
              local_108._0_8_ = uVar15 + local_d0;
              pfVar26 = (float *)(local_180->cstep * (uVar15 + local_d0) * local_180->elemsize +
                                 (long)local_180->data);
              local_1a0 = (long)(this->weight_data).data + uVar15 * local_e0 + local_d8;
              iVar14 = 0;
              local_190 = uVar15;
              while (iVar14 <= (int)uVar21) {
                local_1a8 = (void *)CONCAT44(local_1a8._4_4_,iVar14);
                for (iVar14 = 0; iVar14 <= (int)uVar20; iVar14 = iVar14 + 1) {
                  iVar12 = 0;
                  lVar19 = local_1a0;
                  for (uVar21 = 0; uVar21 != uVar29; uVar21 = uVar21 + 1) {
                    for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
                      iVar12 = iVar12 + (int)*(char *)(lVar19 + uVar20) *
                                        (int)*(char *)((long)local_168.data +
                                                      (long)piVar10[uVar20] +
                                                      (uVar21 + lVar25) *
                                                      local_168.cstep *
                                                      CONCAT44(local_168.elemsize._4_4_,
                                                               (undefined4)local_168.elemsize) +
                                                      (long)iVar14 * (long)this->stride_w +
                                                      (long)local_168.w *
                                                      CONCAT44(local_168.elemsize._4_4_,
                                                               (undefined4)local_168.elemsize) *
                                                      (long)(int)local_1a8 * (long)this->stride_h);
                    }
                    lVar19 = lVar19 + __n;
                  }
                  fVar33 = *(float *)((long)(this->weight_data_int8_scales).data + lVar24 * 4);
                  fVar32 = 0.0;
                  if (fVar33 != 0.0) {
                    fVar32 = 1.0 / (fVar33 * *(float *)((long)(this->bottom_blob_int8_scales).data +
                                                       lVar24 * 4));
                  }
                  fVar32 = (float)iVar12 * fVar32;
                  if (this->bias_term != 0) {
                    fVar32 = fVar32 + *(float *)((long)(this->bias_data).data + local_108._0_8_ * 4)
                    ;
                  }
                  in_XMM4._0_4_ = fVar32;
                  auVar35 = in_XMM4;
                  switch(this->activation_type) {
                  case 1:
                    if (fVar32 <= 0.0) {
                      auVar8._12_4_ = 0;
                      auVar8._0_12_ = in_XMM4._4_12_;
                      auVar35 = auVar8 << 0x20;
                      in_XMM4 = auVar35;
                    }
                    break;
                  case 2:
                    auVar35 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar32) &
                                                     *(this->activation_params).data |
                                                    -(uint)(0.0 < fVar32) & 0x3f800000) * fVar32));
                    break;
                  case 3:
                    pfVar4 = (float *)(this->activation_params).data;
                    fVar33 = *pfVar4;
                    if (fVar32 <= fVar33) {
                      in_XMM4._0_4_ = fVar33;
                    }
                    fVar32 = pfVar4[1];
                    auVar35 = in_XMM4;
                    if (fVar32 < in_XMM4._0_4_) {
LAB_00387bc0:
                      auVar35 = ZEXT416((uint)fVar32);
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar32) {
                      in_XMM4._0_4_ = 0x42b0c0a5;
                    }
                    uVar31 = -(uint)(in_XMM4._0_4_ < -88.37626);
                    auVar6._4_4_ = ~in_XMM4._4_4_ & (in_XMM4._4_4_ ^ 0x80000000);
                    auVar6._0_4_ = ~uVar31 & (uint)-in_XMM4._0_4_;
                    auVar6._8_4_ = ~in_XMM4._8_4_ & (in_XMM4._8_4_ ^ 0x80000000);
                    auVar6._12_4_ = ~in_XMM4._12_4_ & (in_XMM4._12_4_ ^ 0x80000000);
                    in_XMM4 = ZEXT416(uVar31 & 0x42b0c0a5) | auVar6;
                    fVar33 = expf(in_XMM4._0_4_);
                    auVar35 = ZEXT416((uint)(1.0 / (fVar33 + 1.0)));
                    break;
                  case 5:
                    local_118 = in_XMM4;
                    fVar33 = expf(fVar32);
                    fVar33 = logf(fVar33 + 1.0);
                    fVar33 = tanhf(fVar33);
                    auVar35._0_4_ = fVar33 * (float)local_118._0_4_;
                    auVar35._4_12_ = extraout_var_00;
                    break;
                  case 6:
                    pfVar4 = (float *)(this->activation_params).data;
                    fVar33 = *pfVar4;
                    fVar2 = pfVar4[1];
                    fVar36 = -fVar2 / fVar33;
                    auVar35 = ZEXT816(0);
                    if ((fVar36 <= fVar32) && (auVar35 = in_XMM4, fVar32 <= fVar36 + 1.0 / fVar33))
                    {
                      fVar32 = (fVar33 * fVar32 + fVar2) * fVar32;
                      goto LAB_00387bc0;
                    }
                  }
                  if (local_194 < 0x65) {
                    *pfVar26 = auVar35._0_4_;
                    lStack_1e0 = 4;
                  }
                  else {
                    fVar33 = roundf(auVar35._0_4_ *
                                    *(float *)((long)(this->top_blob_int8_scales).data + lVar24 * 4)
                                   );
                    iVar12 = (int)fVar33;
                    if (iVar12 < -0x7e) {
                      iVar12 = -0x7f;
                    }
                    uVar11 = (undefined1)iVar12;
                    if (0x7e < iVar12) {
                      uVar11 = 0x7f;
                    }
                    *(undefined1 *)pfVar26 = uVar11;
                    lStack_1e0 = 1;
                  }
                  pfVar26 = (float *)((long)pfVar26 + lStack_1e0);
                  uVar20 = local_1b0;
                }
                uVar21 = local_178;
                iVar14 = (int)local_1a8 + 1;
              }
              uVar15 = local_190 + 1;
            }
            iVar12 = this->group;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
      iVar12 = (int)local_188;
    }
    piVar9 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_c0.refcount != (int *)0x0) {
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount == 0) {
        if (local_c0.allocator == (Allocator *)0x0) {
          free(local_c0.data);
        }
        else {
          (*(local_c0.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        const int channels_g = channels / group;

        Mat scales(channels);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    float scale_in;
                    if (weight_data_int8_scales[g] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[g];

                    sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                    if (use_int8_requantize)
                    {
                        // requantize
                        float scale_out = top_blob_int8_scales[g];
                        signed char sums8 = float2int8(sumfp32 * scale_out);
                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize
                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g * num_output_g + p];

                        sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                        if (use_int8_requantize)
                        {
                            // requantize
                            float scale_out = top_blob_int8_scales[g];
                            signed char sums8 = float2int8(sumfp32 * scale_out);
                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize
                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}